

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O0

double GraphBase::inf_eval(Graph *graph,
                          vector<unsigned_long,_std::allocator<unsigned_long>_> *vecSeed,
                          CascadeModel model,uint32_t evalsize)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  void *__ptr;
  ostream *poVar6;
  reference puVar7;
  reference pvVar8;
  const_reference pvVar9;
  reference ppVar10;
  reference pvVar11;
  reference puVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  iterator iStack_208;
  uint activatedNode;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  pair<unsigned_int,_float> *nbr_1;
  const_iterator __end5;
  const_iterator __begin5;
  value_type *__range5;
  pair<unsigned_int,_float> *nbr;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  unsigned_long local_1a8;
  unsigned_long seed;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  double evalTime;
  uint32_t i;
  unsigned_long seedId;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  value_type_conflict4 local_150;
  undefined1 local_148 [8];
  vector<double,_std::allocator<double>_> vecActivateWeight;
  allocator<double> local_119;
  undefined1 local_118 [8];
  vector<double,_std::allocator<double>_> vecThr;
  uint32_t *visited;
  bool *activated;
  double inf;
  size_type numV;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecActivated;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> Que;
  uint32_t currProgress;
  uint32_t nodeId;
  Timer EvalTimer;
  uint32_t evalsize_local;
  CascadeModel model_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vecSeed_local;
  Graph *graph_local;
  double *psfmt64_1;
  double r_1;
  double *psfmt64;
  double r;
  
  EvalTimer.__processName._0_4_ = evalsize;
  EvalTimer.__processName._4_4_ = model;
  Timer::Timer((Timer *)&currProgress);
  Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._0_4_ = 0;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)
             &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV);
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size(graph);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(vecSeed);
  auVar16._8_4_ = (int)(sVar5 >> 0x20);
  auVar16._0_8_ = sVar5;
  auVar16._12_4_ = 0x45300000;
  activated = (bool *)((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
  __ptr = calloc(sVar4,1);
  vecThr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)calloc(sVar4,4);
  std::allocator<double>::allocator(&local_119);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_118,sVar4,&local_119);
  std::allocator<double>::~allocator(&local_119);
  local_150 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&__range1 + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_148,sVar4,&local_150,
             (allocator<double> *)((long)&__range1 + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&__range1 + 7));
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vecSeed);
  seedId = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(vecSeed);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&seedId), bVar3) {
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    *(undefined1 *)((long)__ptr + *puVar7) = 1;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  for (evalTime._4_4_ = 0; evalTime._4_4_ < (uint32_t)EvalTimer.__processName;
      evalTime._4_4_ = evalTime._4_4_ + 1) {
    if ((uint32_t)EvalTimer.__processName *
        (uint)Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node <= evalTime._4_4_ * 100) {
      dVar15 = Timer::get_operation_time((Timer *)&currProgress);
      if (100.0 < dVar15) {
        poVar6 = std::operator<<((ostream *)&std::cout,"\tMC-Progress at: ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,(uint)Que.c.
                                         super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
        poVar6 = std::operator<<(poVar6,"%, ");
        poVar6 = std::operator<<(poVar6,"time used: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar15);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._0_4_ =
           (uint)Que.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node + 0x14;
    }
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vecSeed);
    seed = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(vecSeed);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&seed), bVar3) {
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      local_1a8 = *puVar7;
      __range4._4_4_ = (undefined4)local_1a8;
      std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)((long)&__range4 + 4));
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    if (EvalTimer.__processName._4_4_ == IC) {
      while (bVar3 = std::
                     queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                     empty((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&vecActivated.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar8 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::front((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&vecActivated.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
        uVar2 = *pvVar8;
        std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                  ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](graph,(ulong)uVar2);
        __end4 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::begin(pvVar9);
        nbr = (pair<unsigned_int,_float> *)
              std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::end(pvVar9);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                           *)&nbr), bVar3) {
          ppVar10 = __gnu_cxx::
                    __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                    ::operator*(&__end4);
          if ((*(byte *)((long)__ptr + (ulong)ppVar10->first) & 1) == 0) {
            if (0x17d < dsfmt_global_data.idx) {
              dsfmt_gen_rand_all(&dsfmt_global_data);
              dsfmt_global_data.idx = 0;
            }
            iVar14 = dsfmt_global_data.idx + 1;
            lVar13 = (long)dsfmt_global_data.idx;
            dsfmt_global_data.idx = iVar14;
            if (2.0 - dsfmt_global_data.status[0].d[lVar13] <= (double)ppVar10->second) {
              *(undefined1 *)((long)__ptr + (ulong)ppVar10->first) = 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV,
                         &ppVar10->first);
              std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              push((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar10->first);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end4);
        }
      }
    }
    else if (EvalTimer.__processName._4_4_ == LT) {
      while (bVar3 = std::
                     queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                     empty((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&vecActivated.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar8 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::front((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&vecActivated.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
        uVar2 = *pvVar8;
        std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                  ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](graph,(ulong)uVar2);
        __end5 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::begin(pvVar9);
        nbr_1 = (pair<unsigned_int,_float> *)
                std::
                vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::end(pvVar9);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                           *)&nbr_1), bVar3) {
          ppVar10 = __gnu_cxx::
                    __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                    ::operator*(&__end5);
          if ((*(byte *)((long)__ptr + (ulong)ppVar10->first) & 1) == 0) {
            if (*(uint *)((long)vecThr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage +
                         (ulong)ppVar10->first * 4) < evalTime._4_4_ + 1) {
              *(uint *)((long)vecThr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + (ulong)ppVar10->first * 4)
                   = evalTime._4_4_ + 1;
              if (0x17d < dsfmt_global_data.idx) {
                dsfmt_gen_rand_all(&dsfmt_global_data);
                dsfmt_global_data.idx = 0;
              }
              dVar15 = dsfmt_global_data.status[0].d[dsfmt_global_data.idx];
              dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_118,
                                   (ulong)ppVar10->first);
              *pvVar11 = 2.0 - dVar15;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_148,
                                   (ulong)ppVar10->first);
              *pvVar11 = 0.0;
            }
            fVar1 = ppVar10->second;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_148,
                                 (ulong)ppVar10->first);
            *pvVar11 = (double)fVar1 + *pvVar11;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_148,
                                 (ulong)ppVar10->first);
            dVar15 = *pvVar11;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_118,
                                 (ulong)ppVar10->first);
            if (*pvVar11 <= dVar15) {
              *(undefined1 *)((long)__ptr + (ulong)ppVar10->first) = 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV,
                         &ppVar10->first);
              std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              push((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar10->first);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end5);
        }
      }
    }
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV);
    auVar17._8_4_ = (int)(sVar4 >> 0x20);
    auVar17._0_8_ = sVar4;
    auVar17._12_4_ = 0x45300000;
    activated = (bool *)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) /
                         (double)(uint32_t)EvalTimer.__processName + (double)activated);
    __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV);
    iStack_208 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV);
    while (bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffdf8), bVar3) {
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end2_1);
      *(undefined1 *)((long)__ptr + (ulong)*puVar12) = 0;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2_1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV);
  }
  free(__ptr);
  free(vecThr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_148);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_118);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numV);
  std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~queue
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &vecActivated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (double)activated;
}

Assistant:

static double inf_eval(const Graph& graph, const std::vector<size_t>& vecSeed, const CascadeModel model,
                           const uint32_t evalsize = 10000)
    {
        Timer EvalTimer;
//        std::cout << "  >>>Evaluate influence...\n";
        uint32_t nodeId, currProgress = 0;
        std::queue<uint32_t> Que;
        std::vector<uint32_t> vecActivated;

        const auto numV = graph.size();
        auto inf = (double)vecSeed.size();
        bool* activated = (bool *)calloc(numV, sizeof(bool));
        auto* visited = (uint32_t *)calloc(numV, sizeof(uint32_t));
        std::vector<double> vecThr(numV);
        std::vector<double> vecActivateWeight(numV, 0.0);
        for (auto seedId : vecSeed) activated[seedId] = true;
        for (uint32_t i = 0; i < evalsize; i++)
        {
            if (i * 100 >= evalsize * currProgress)
            {
                const auto evalTime = EvalTimer.get_operation_time();
                if (evalTime > 100)
                    std::cout << "\tMC-Progress at: " << currProgress << "%, " <<
                    "time used: " << evalTime << std::endl;
                currProgress += 20;
            }
            for (auto seed : vecSeed)
            {
                Que.push(seed);
            }

            // BFS traversal
            if (model == IC)
            {
                while (!Que.empty())
                {
                    nodeId = Que.front();
                    Que.pop();
                    for (auto& nbr : graph[nodeId])
                    {
                        if (activated[nbr.first]) continue;
                        if (dsfmt_gv_genrand_open_close() <= nbr.second)
                        {
                            activated[nbr.first] = true;
                            vecActivated.push_back(nbr.first);
                            Que.push(nbr.first);
                        }
                    }
                }
            }
            else if (model == LT)
            {
                while (!Que.empty())
                {
                    nodeId = Que.front();
                    Que.pop();
                    for (auto& nbr : graph[nodeId])
                    {
                        if (activated[nbr.first]) continue;
                        if (visited[nbr.first] < i + 1)
                        {
                            // First time visit this node
                            visited[nbr.first] = i + 1;
                            vecThr[nbr.first] = dsfmt_gv_genrand_open_close();
                            vecActivateWeight[nbr.first] = 0.0;
                        }
                        vecActivateWeight[nbr.first] += nbr.second;
                        if (vecActivateWeight[nbr.first] >= vecThr[nbr.first])
                        {
                            // Activation weight is greater than threshold
                            activated[nbr.first] = true;
                            vecActivated.push_back(nbr.first);
                            Que.push(nbr.first);
                        }
                    }
                }
            }
            inf += (double)vecActivated.size() / evalsize;
            for (auto activatedNode : vecActivated) activated[activatedNode] = false;
            vecActivated.clear();
        }
        free(activated);
        free(visited);
//        std::cout << "  >>>MC-Influence spread: " << inf << ", time used (sec): " <<
//        EvalTimer.get_total_time() << std::endl;
        return inf;
    }